

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
          (pdqsort_detail *this,
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                end,anon_class_16_2_a9e7a8bd comp,int bad_allowed,bool leftmost)

{
  pointer ppVar1;
  double dVar2;
  undefined8 uVar3;
  pointer ppVar4;
  pointer ppVar5;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  c;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  c_00;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  c_01;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  end_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:106:11)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:106:11)>
  __comp_00;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var10;
  FractionalInteger *pFVar11;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var12;
  long lVar13;
  long lVar14;
  HighsTableauSeparator *pHVar15;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var16;
  FractionalInteger *pFVar17;
  anon_class_16_2_a9e7a8bd comp_00;
  anon_class_16_2_a9e7a8bd comp_01;
  anon_class_16_2_a9e7a8bd comp_02;
  anon_class_16_2_a9e7a8bd comp_03;
  anon_class_16_2_a9e7a8bd comp_04;
  anon_class_16_2_a9e7a8bd comp_05;
  anon_class_16_2_a9e7a8bd comp_06;
  anon_class_16_2_a9e7a8bd comp_07;
  anon_class_16_2_a9e7a8bd comp_local;
  uint local_104;
  FractionalInteger *local_d8;
  int local_cc;
  FractionalInteger local_c8;
  ulong local_90;
  FractionalInteger local_88;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_48;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_40;
  long local_38;
  
  comp_local.this = (HighsTableauSeparator *)comp.edgeWt;
  local_cc = (int)comp.this;
  comp_local.edgeWt._0_1_ = SUB81(end._M_current,0);
  comp_local.edgeWt._1_7_ = (undefined7)((ulong)end._M_current >> 8);
  local_d8 = begin._M_current + -1;
  local_40._M_current = begin._M_current + -2;
  local_48._M_current = begin._M_current + -3;
  local_104 = bad_allowed;
LAB_002e9acf:
  do {
    lVar14 = (long)begin._M_current - (long)this;
    uVar7 = lVar14 / 0x38;
    if (lVar14 < 0x540) {
      local_88.fractionality = (double)CONCAT71(comp_local.edgeWt._1_7_,comp_local.edgeWt._0_1_);
      local_88.row_ep_norm2._0_4_ = SUB84(comp_local.this,0);
      local_88.row_ep_norm2._4_4_ = (undefined4)((ulong)comp_local.this >> 0x20);
      if ((local_104 & 1) == 0) {
        if ((FractionalInteger *)this != begin._M_current) {
          while (pFVar11 = (FractionalInteger *)this, this = (pdqsort_detail *)(pFVar11 + 1),
                (FractionalInteger *)this != begin._M_current) {
            bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                              ((anon_class_16_2_a9e7a8bd *)&local_88,(FractionalInteger *)this,
                               pFVar11);
            if (bVar6) {
              local_c8.fractionality = ((FractionalInteger *)this)->fractionality;
              local_c8._20_8_ = *(undefined8 *)((long)&pFVar11[1].score + 4);
              local_c8.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar11[1].row_ep_norm2 + 4) >> 0x20);
              local_c8.row_ep_norm2._0_4_ = SUB84(pFVar11[1].row_ep_norm2,0);
              local_c8.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar11[1].row_ep_norm2 >> 0x20);
              local_c8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   pFVar11[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_c8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   pFVar11[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_c8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   pFVar11[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pFVar11[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar11[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pFVar11[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar11 = (FractionalInteger *)this;
              do {
                pFVar17 = pFVar11 + -1;
                FractionalInteger::operator=(pFVar11,pFVar17);
                bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::
                        operator()((anon_class_16_2_a9e7a8bd *)&local_88,&local_c8,pFVar11 + -2);
                pFVar11 = pFVar11 + -1;
              } while (bVar6);
              FractionalInteger::operator=(pFVar17,&local_c8);
              std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              ~_Vector_base(&local_c8.row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           );
            }
          }
        }
      }
      else if ((FractionalInteger *)this != begin._M_current) {
        lVar14 = 0;
        _Var10._M_current = (FractionalInteger *)this;
        while (pFVar11 = _Var10._M_current + 1, pFVar11 != begin._M_current) {
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                            ((anon_class_16_2_a9e7a8bd *)&local_88,pFVar11,_Var10._M_current);
          if (bVar6) {
            local_c8.fractionality = pFVar11->fractionality;
            local_c8._20_8_ = *(undefined8 *)((long)&_Var10._M_current[1].score + 4);
            local_c8.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&_Var10._M_current[1].row_ep_norm2 + 4) >> 0x20);
            local_c8.row_ep_norm2._0_4_ = SUB84(_Var10._M_current[1].row_ep_norm2,0);
            local_c8.row_ep_norm2._4_4_ =
                 (undefined4)((ulong)_Var10._M_current[1].row_ep_norm2 >> 0x20);
            local_c8.row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 _Var10._M_current[1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_c8.row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 _Var10._M_current[1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_c8.row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 _Var10._M_current[1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            _Var10._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            _Var10._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Var10._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar13 = lVar14;
            do {
              FractionalInteger::operator=(_Var10._M_current + 1,_Var10._M_current);
              _Var12._M_current = (FractionalInteger *)this;
              if (lVar13 == 0) break;
              bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::
                      operator()((anon_class_16_2_a9e7a8bd *)&local_88,&local_c8,
                                 _Var10._M_current + -1);
              lVar13 = lVar13 + 0x38;
              _Var12._M_current = _Var10._M_current;
              _Var10._M_current = _Var10._M_current + -1;
            } while (bVar6);
            FractionalInteger::operator=(_Var12._M_current,&local_c8);
            std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            ~_Vector_base(&local_c8.row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         );
          }
          lVar14 = lVar14 + -0x38;
          _Var10._M_current = pFVar11;
        }
      }
      return;
    }
    uVar9 = uVar7 >> 1;
    _Var10._M_current = (FractionalInteger *)((long)this + uVar9 * 0x38);
    _Var12._M_current._1_7_ = comp_local.edgeWt._1_7_;
    _Var12._M_current._0_1_ = comp_local.edgeWt._0_1_;
    local_38 = lVar14;
    if (uVar7 < 0x81) {
      comp_07.this = (HighsTableauSeparator *)local_d8;
      comp_07.edgeWt = (double **)comp_local.this;
      pHVar15 = comp_local.this;
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                ((pdqsort_detail *)_Var10._M_current,
                 (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                  )this,(__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                         )local_d8,_Var12,comp_07);
    }
    else {
      comp_03.this = (HighsTableauSeparator *)local_d8;
      comp_03.edgeWt = (double **)comp_local.this;
      _Var16._M_current = local_d8;
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                (this,_Var10,
                 (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                  )local_d8,_Var12,comp_03);
      c._M_current._1_7_ = comp_local.edgeWt._1_7_;
      c._M_current._0_1_ = comp_local.edgeWt._0_1_;
      comp_04.this = (HighsTableauSeparator *)_Var16._M_current;
      comp_04.edgeWt = (double **)comp_local.this;
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                ((pdqsort_detail *)((long)this + 0x38),
                 (FractionalInteger *)((long)this + (uVar9 - 1) * 0x38),local_40,c,comp_04);
      c_00._M_current._1_7_ = comp_local.edgeWt._1_7_;
      c_00._M_current._0_1_ = comp_local.edgeWt._0_1_;
      comp_05.this = (HighsTableauSeparator *)_Var16._M_current;
      comp_05.edgeWt = (double **)comp_local.this;
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                ((pdqsort_detail *)((long)this + 0x70),
                 (FractionalInteger *)((long)this + (uVar9 + 1) * 0x38),local_48,c_00,comp_05);
      c_01._M_current._1_7_ = comp_local.edgeWt._1_7_;
      c_01._M_current._0_1_ = comp_local.edgeWt._0_1_;
      comp_06.this = (HighsTableauSeparator *)_Var16._M_current;
      comp_06.edgeWt = (double **)comp_local.this;
      pHVar15 = comp_local.this;
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                ((pdqsort_detail *)((long)this + (uVar9 - 1) * 0x38),_Var10,
                 (FractionalInteger *)((long)this + (uVar9 + 1) * 0x38),c_01,comp_06);
      std::swap<FractionalInteger>((FractionalInteger *)this,_Var10._M_current);
    }
    if (((local_104 & 1) == 0) &&
       (bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                          (&comp_local,(FractionalInteger *)((long)this + -0x38),
                           (FractionalInteger *)this), !bVar6)) {
      local_88.fractionality = (double)CONCAT71(comp_local.edgeWt._1_7_,comp_local.edgeWt._0_1_);
      local_88.row_ep_norm2._0_4_ = SUB84(comp_local.this,0);
      local_88.row_ep_norm2._4_4_ = (undefined4)((ulong)comp_local.this >> 0x20);
      local_c8.fractionality = ((FractionalInteger *)this)->fractionality;
      local_c8._20_8_ = *(undefined8 *)((long)&((FractionalInteger *)this)->score + 4);
      local_c8.score._0_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) >> 0x20);
      local_c8.row_ep_norm2._0_4_ = SUB84(((FractionalInteger *)this)->row_ep_norm2,0);
      local_c8.row_ep_norm2._4_4_ =
           (undefined4)((ulong)((FractionalInteger *)this)->row_ep_norm2 >> 0x20);
      local_c8.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (((FractionalInteger *)this)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_c8.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (((FractionalInteger *)this)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_c8.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (((FractionalInteger *)this)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (((FractionalInteger *)this)->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (((FractionalInteger *)this)->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((FractionalInteger *)this)->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar14 = -0x38;
      _Var10._M_current = begin._M_current;
      do {
        _Var10._M_current = _Var10._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                          ((anon_class_16_2_a9e7a8bd *)&local_88,&local_c8,_Var10._M_current);
        lVar14 = lVar14 + 0x38;
      } while (bVar6);
      _Var12._M_current = (FractionalInteger *)this;
      if (lVar14 == 0) {
        do {
          if (_Var10._M_current <= _Var12._M_current) break;
          _Var12._M_current = _Var12._M_current + 1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                            ((anon_class_16_2_a9e7a8bd *)&local_88,&local_c8,_Var12._M_current);
        } while (!bVar6);
      }
      else {
        do {
          _Var12._M_current = _Var12._M_current + 1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                            ((anon_class_16_2_a9e7a8bd *)&local_88,&local_c8,_Var12._M_current);
        } while (!bVar6);
      }
      while (_Var12._M_current < _Var10._M_current) {
        std::swap<FractionalInteger>(_Var12._M_current,_Var10._M_current);
        do {
          _Var10._M_current = _Var10._M_current + -1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                            ((anon_class_16_2_a9e7a8bd *)&local_88,&local_c8,_Var10._M_current);
        } while (bVar6);
        do {
          _Var12._M_current = _Var12._M_current + 1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                            ((anon_class_16_2_a9e7a8bd *)&local_88,&local_c8,_Var12._M_current);
        } while (!bVar6);
      }
      FractionalInteger::operator=((FractionalInteger *)this,_Var10._M_current);
      FractionalInteger::operator=(_Var10._M_current,&local_c8);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base(&local_c8.row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   );
      this = (pdqsort_detail *)(_Var10._M_current + 1);
      goto LAB_002e9acf;
    }
    local_88.fractionality = (double)CONCAT71(comp_local.edgeWt._1_7_,comp_local.edgeWt._0_1_);
    local_88.row_ep_norm2._0_4_ = SUB84(comp_local.this,0);
    local_88.row_ep_norm2._4_4_ = (undefined4)((ulong)comp_local.this >> 0x20);
    local_c8.fractionality = ((FractionalInteger *)this)->fractionality;
    local_c8._20_8_ = *(undefined8 *)((long)&((FractionalInteger *)this)->score + 4);
    local_c8.score._0_4_ =
         (undefined4)
         ((ulong)*(undefined8 *)((long)&((FractionalInteger *)this)->row_ep_norm2 + 4) >> 0x20);
    local_c8.row_ep_norm2._0_4_ = SUB84(((FractionalInteger *)this)->row_ep_norm2,0);
    local_c8.row_ep_norm2._4_4_ =
         (undefined4)((ulong)((FractionalInteger *)this)->row_ep_norm2 >> 0x20);
    local_c8.row_ep.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (((FractionalInteger *)this)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c8.row_ep.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (((FractionalInteger *)this)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_c8.row_ep.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (((FractionalInteger *)this)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (((FractionalInteger *)this)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((FractionalInteger *)this)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((FractionalInteger *)this)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar14 = 0x38;
    _Var10._M_current = (FractionalInteger *)this;
    do {
      _Var10._M_current = _Var10._M_current + 1;
      bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                        ((anon_class_16_2_a9e7a8bd *)&local_88,_Var10._M_current,&local_c8);
      lVar14 = lVar14 + -0x38;
    } while (bVar6);
    _Var12._M_current = begin._M_current;
    pFVar11 = _Var10._M_current;
    if (lVar14 == 0) {
      do {
        pFVar17 = _Var12._M_current;
        if (_Var12._M_current <= _Var10._M_current) break;
        _Var12._M_current = _Var12._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                          ((anon_class_16_2_a9e7a8bd *)&local_88,_Var12._M_current,&local_c8);
        pFVar17 = _Var12._M_current;
      } while (!bVar6);
    }
    else {
      do {
        _Var12._M_current = _Var12._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                          ((anon_class_16_2_a9e7a8bd *)&local_88,_Var12._M_current,&local_c8);
        pFVar17 = _Var12._M_current;
      } while (!bVar6);
    }
    while (pFVar11 < _Var12._M_current) {
      std::swap<FractionalInteger>(pFVar11,_Var12._M_current);
      do {
        pFVar11 = pFVar11 + 1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                          ((anon_class_16_2_a9e7a8bd *)&local_88,pFVar11,&local_c8);
      } while (bVar6);
      do {
        _Var12._M_current = _Var12._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                          ((anon_class_16_2_a9e7a8bd *)&local_88,_Var12._M_current,&local_c8);
      } while (!bVar6);
    }
    _Var12._M_current = pFVar11 + -1;
    FractionalInteger::operator=((FractionalInteger *)this,_Var12._M_current);
    FractionalInteger::operator=(_Var12._M_current,&local_c8);
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&local_c8.row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 );
    uVar9 = ((long)_Var12._M_current - (long)this) / 0x38;
    uVar8 = ((long)begin._M_current - (long)pFVar11) / 0x38;
    if (((long)uVar9 < (long)(uVar7 >> 3)) || ((long)uVar8 < (long)(uVar7 >> 3))) {
      local_cc = local_cc + -1;
      if (local_cc == 0) {
        __comp._M_comp.edgeWt._1_7_ = comp_local.edgeWt._1_7_;
        __comp._M_comp.edgeWt._0_1_ = comp_local.edgeWt._0_1_;
        __comp._M_comp.this = comp_local.this;
        uVar9 = uVar7 - 2 >> 1;
        pFVar11 = (FractionalInteger *)((long)this + uVar9 * 0x38);
        do {
          local_c8.fractionality = pFVar11->fractionality;
          local_c8._20_8_ = *(undefined8 *)((long)&pFVar11->score + 4);
          local_c8.score._0_4_ =
               (undefined4)((ulong)*(undefined8 *)((long)&pFVar11->row_ep_norm2 + 4) >> 0x20);
          local_c8.row_ep_norm2._0_4_ = SUB84(pFVar11->row_ep_norm2,0);
          local_c8.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar11->row_ep_norm2 >> 0x20);
          local_88.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pFVar11->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88.fractionality = pFVar11->fractionality;
          dVar2 = pFVar11->row_ep_norm2;
          uVar3 = *(undefined8 *)((long)&pFVar11->row_ep_norm2 + 4);
          local_88._20_8_ = *(undefined8 *)((long)&pFVar11->score + 4);
          local_88.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pFVar11->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_88.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pFVar11->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          (pFVar11->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar11->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar11->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88.score._0_4_ = (undefined4)((ulong)uVar3 >> 0x20);
          local_88.row_ep_norm2._0_4_ = SUB84(dVar2,0);
          local_88.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
          local_c8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>>
                    ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      )this,uVar9,uVar7,&local_88,__comp);
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_88.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_c8.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          pFVar11 = pFVar11 + -1;
          bVar6 = uVar9 != 0;
          uVar9 = uVar9 - 1;
        } while (bVar6);
        __comp_00._M_comp.edgeWt._1_7_ = comp_local.edgeWt._1_7_;
        __comp_00._M_comp.edgeWt._0_1_ = comp_local.edgeWt._0_1_;
        __comp_00._M_comp.this = comp_local.this;
        while (0x38 < local_38) {
          local_c8.fractionality = local_d8->fractionality;
          local_c8._20_8_ = *(undefined8 *)((long)&local_d8->score + 4);
          local_c8.score._0_4_ =
               (undefined4)((ulong)*(undefined8 *)((long)&local_d8->row_ep_norm2 + 4) >> 0x20);
          local_c8.row_ep_norm2._0_4_ = SUB84(local_d8->row_ep_norm2,0);
          local_c8.row_ep_norm2._4_4_ = (undefined4)((ulong)local_d8->row_ep_norm2 >> 0x20);
          ppVar1 = (local_d8->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_38 = local_38 + -0x38;
          lVar14 = local_38 / 0x38;
          ppVar4 = (local_d8->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar5 = (local_d8->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (local_d8->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_d8->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_d8->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          FractionalInteger::operator=(local_d8,(FractionalInteger *)this);
          local_88.fractionality = local_c8.fractionality;
          local_88.row_ep_norm2._0_4_ = local_c8.row_ep_norm2._0_4_;
          local_88.row_ep_norm2._4_4_ = local_c8.row_ep_norm2._4_4_;
          local_88.score._0_4_ = local_c8.score._0_4_;
          local_88._20_8_ = local_c8._20_8_;
          local_c8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_88.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          local_88.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar5;
          local_88.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>>
                    ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      )this,0,lVar14,&local_88,__comp_00);
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_88.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_c8.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          local_d8 = local_d8 + -1;
        }
        return;
      }
      local_90 = uVar8;
      if (0x508 < (long)_Var12._M_current - (long)this) {
        uVar7 = uVar9 >> 2;
        std::swap<FractionalInteger>
                  ((FractionalInteger *)this,(FractionalInteger *)((long)this + uVar7 * 0x38));
        std::swap<FractionalInteger>(pFVar11 + -2,_Var12._M_current + -uVar7);
        if (0x80 < uVar9) {
          std::swap<FractionalInteger>
                    ((FractionalInteger *)((long)this + 0x38),
                     (FractionalInteger *)((long)this + (uVar7 + 1) * 0x38));
          std::swap<FractionalInteger>
                    ((FractionalInteger *)((long)this + 0x70),
                     (FractionalInteger *)((long)this + (uVar7 + 2) * 0x38));
          std::swap<FractionalInteger>(pFVar11 + -3,_Var12._M_current + ~uVar7);
          std::swap<FractionalInteger>(pFVar11 + -4,_Var12._M_current + (-2 - uVar7));
        }
      }
      if (0x508 < (long)begin._M_current - (long)pFVar11) {
        uVar7 = local_90 >> 2;
        std::swap<FractionalInteger>(pFVar11,pFVar11 + uVar7);
        std::swap<FractionalInteger>(local_d8,begin._M_current + -uVar7);
        if (0x80 < local_90) {
          std::swap<FractionalInteger>(pFVar11 + 1,_Var12._M_current + uVar7 + 2);
          std::swap<FractionalInteger>(pFVar11 + 2,_Var12._M_current + uVar7 + 3);
          std::swap<FractionalInteger>(local_40._M_current,begin._M_current + ~uVar7);
          std::swap<FractionalInteger>(local_48._M_current,begin._M_current + (-2 - uVar7));
        }
      }
    }
    else if (((pFVar17 <= _Var10._M_current) &&
             (_Var10._M_current._1_7_ = comp_local.edgeWt._1_7_,
             _Var10._M_current._0_1_ = comp_local.edgeWt._0_1_, comp_00.this = pHVar15,
             comp_00.edgeWt = (double **)comp_local.this,
             bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                               (this,_Var12,_Var10,comp_00), bVar6)) &&
            (_Var16._M_current._1_7_ = comp_local.edgeWt._1_7_,
            _Var16._M_current._0_1_ = comp_local.edgeWt._0_1_, comp_01.this = pHVar15,
            comp_01.edgeWt = (double **)comp_local.this,
            bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                              ((pdqsort_detail *)pFVar11,begin,_Var16,comp_01), bVar6)) {
      return;
    }
    end_00._M_current._1_7_ = comp_local.edgeWt._1_7_;
    end_00._M_current._0_1_ = (bool)comp_local.edgeWt._0_1_;
    comp_02.this._0_4_ = local_cc;
    comp_02.edgeWt = (double **)comp_local.this;
    comp_02.this._4_4_ = 0;
    pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
              (this,_Var12,end_00,comp_02,local_104 & 1,(bool)comp_local.edgeWt._0_1_);
    local_104 = 0;
    this = (pdqsort_detail *)pFVar11;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }